

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btCollisionWorld::serializeCollisionObjects(btCollisionWorld *this,btSerializer *serializer)

{
  btCollisionObject *pbVar1;
  ulong uVar2;
  btCollisionShape **ppbVar3;
  long lVar4;
  btCollisionShape *shape;
  btHashMap<btHashPtr,_btCollisionShape_*> serializedShapes;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_c0;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_b8;
  btHashMap<btHashPtr,_btCollisionShape_*> local_b0;
  
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (btCollisionShape **)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (btHashPtr *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  for (lVar4 = 0; uVar2 = (ulong)(this->m_collisionObjects).m_size, lVar4 < (long)uVar2;
      lVar4 = lVar4 + 1) {
    local_c0 = (anon_union_8_2_511b660c_for_btHashPtr_0)
               (this->m_collisionObjects).m_data[lVar4]->m_collisionShape;
    local_b8 = local_c0;
    ppbVar3 = btHashMap<btHashPtr,_btCollisionShape_*>::find(&local_b0,(btHashPtr *)&local_b8);
    if (ppbVar3 == (btCollisionShape **)0x0) {
      local_b8.m_pointer = local_c0.m_pointer;
      btHashMap<btHashPtr,_btCollisionShape_*>::insert
                (&local_b0,(btHashPtr *)&local_b8,(btCollisionShape **)&local_c0.m_pointer);
      (**(code **)(*local_c0.m_pointer + 0x78))(local_c0.m_pointer,serializer);
    }
  }
  for (lVar4 = 0; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
    pbVar1 = (this->m_collisionObjects).m_data[lVar4];
    if ((pbVar1->m_internalType == 0x40) || (pbVar1->m_internalType == 1)) {
      (*pbVar1->_vptr_btCollisionObject[6])(pbVar1,serializer);
      uVar2 = (ulong)(uint)(this->m_collisionObjects).m_size;
    }
  }
  btHashMap<btHashPtr,_btCollisionShape_*>::~btHashMap(&local_b0);
  return;
}

Assistant:

void	btCollisionWorld::serializeCollisionObjects(btSerializer* serializer)
{
	int i;

	///keep track of shapes already serialized
	btHashMap<btHashPtr,btCollisionShape*>	serializedShapes;

	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btCollisionShape* shape = colObj->getCollisionShape();

		if (!serializedShapes.find(shape))
		{
			serializedShapes.insert(shape,shape);
			shape->serializeSingleShape(serializer);
		}
	}

	//serialize all collision objects
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		if ((colObj->getInternalType() == btCollisionObject::CO_COLLISION_OBJECT) || (colObj->getInternalType() == btCollisionObject::CO_FEATHERSTONE_LINK))
		{
			colObj->serializeSingleObject(serializer);
		}
	}
}